

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCStream(ZSTD_CStream *zcs,unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  size_t sVar1;
  long in_RSI;
  long in_RDI;
  undefined1 in_stack_00000000 [40];
  ZSTD_CCtx_params params;
  size_t in_stack_fffffffffffffee0;
  U64 in_stack_fffffffffffffee8;
  ZSTD_CCtx_params *in_stack_fffffffffffffef0;
  undefined4 local_a4;
  undefined8 local_9c;
  undefined4 local_94;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  memcpy(&stack0xffffffffffffff78,(void *)(in_RDI + 0x10),0x78);
  if (in_RSI == 0) {
    in_RSI = -1;
  }
  uVar2 = 1;
  ZSTD_getCParamsFromCCtxParams
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  params_00.cParams.chainLog = (int)in_stack_ffffffffffffffb8;
  params_00.cParams.hashLog = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  params_00.format = (int)in_stack_ffffffffffffffb0;
  params_00.cParams.windowLog = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  params_00.cParams.searchLog = (int)in_stack_ffffffffffffffc0;
  params_00.cParams.searchLength = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  params_00.cParams.targetLength = (int)in_stack_ffffffffffffffc8;
  params_00.cParams.strategy = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  params_00.fParams.contentSizeFlag = (int)in_stack_ffffffffffffffd0;
  params_00.fParams.checksumFlag = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  params_00.fParams.noDictIDFlag = (int)in_stack_ffffffffffffffd8;
  params_00.compressionLevel = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  params_00.disableLiteralCompression = (int)in_stack_ffffffffffffffe0;
  params_00.forceWindow = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  params_00.nbWorkers = (int)in_stack_ffffffffffffffe8;
  params_00.jobSize = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  params_00.overlapSizeLog = (int)in_RSI;
  params_00.ldmParams.enableLdm = (int)((ulong)in_RSI >> 0x20);
  params_00.ldmParams.hashLog = (int)in_RDI;
  params_00.ldmParams.bucketSizeLog = (int)((ulong)in_RDI >> 0x20);
  params_00._80_40_ = in_stack_00000000;
  sVar1 = ZSTD_resetCStream_internal
                    ((ZSTD_CStream *)CONCAT44(in_stack_ffffffffffffff9c,uVar2),
                     (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     CONCAT44(local_94,(int)((ulong)local_9c >> 0x20)),
                     (ZSTD_dictContentType_e)local_9c,
                     (ZSTD_CDict *)CONCAT44(local_a4,in_stack_ffffffffffffff78),params_00,
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return sVar1;
}

Assistant:

size_t ZSTD_resetCStream(ZSTD_CStream* zcs, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params params = zcs->requestedParams;
    DEBUGLOG(4, "ZSTD_resetCStream: pledgedSrcSize = %u", (U32)pledgedSrcSize);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    params.fParams.contentSizeFlag = 1;
    params.cParams = ZSTD_getCParamsFromCCtxParams(&params, pledgedSrcSize, 0);
    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}